

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* util::rpn_parse(stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *__return_storage_ptr__,string *expr)

{
  char *pcVar1;
  ulong uVar2;
  long local_48;
  size_t i;
  string tok;
  string *expr_local;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *stack;
  
  tok.field_2._M_local_buf[0xf] = '\0';
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&i);
  local_48 = std::__cxx11::string::length();
  do {
    local_48 = local_48 + -1;
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)expr);
    if (*pcVar1 == ' ') {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) == 0) {
        rpn_parse_str_reverse((string *)&i);
        rpn_map_multichar_op((string *)&i);
        std::
        stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push(__return_storage_ptr__,(value_type *)&i);
        std::__cxx11::string::clear();
      }
    }
    else {
      pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)expr);
      std::__cxx11::string::operator+=((string *)&i,*pcVar1);
    }
  } while (local_48 != 0);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    rpn_parse_str_reverse((string *)&i);
    rpn_map_multichar_op((string *)&i);
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push(__return_storage_ptr__,(value_type *)&i);
  }
  tok.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&i);
  if ((tok.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~stack(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::stack<std::string> rpn_parse(std::string expr)
{
	std::stack<std::string> stack;
	std::string tok;

	std::size_t i = expr.length() - 1;
	do
	{
		if (expr[i] != ' ')
		{
			tok += expr[i];
		}
		else if (!tok.empty())
		{
			rpn_parse_str_reverse(tok);
			rpn_map_multichar_op(tok);
			stack.push(tok);
			tok.clear();
		}
	} while (i-- != 0);

	if (!tok.empty())
	{
		rpn_parse_str_reverse(tok);
		rpn_map_multichar_op(tok);
		stack.push(tok);
	}

	return stack;
}